

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystem.cpp
# Opt level: O1

void __thiscall chrono::ChSystem::ArchiveIN(ChSystem *this,ChArchiveIn *marchive)

{
  element_type *peVar1;
  ChFunctorArchiveInSpecific<chrono::ChVector<double>_> specFuncA;
  ChNameValue<std::shared_ptr<chrono::ChContactContainer>_> local_48;
  shared_ptr<chrono::ChContactContainer> local_30;
  
  ChArchiveIn::VersionRead<chrono::ChSystem>(marchive);
  ChAssembly::ArchiveIN(&this->assembly,marchive);
  local_48._value = &this->contact_container;
  local_48._name = "contact_container";
  local_48._flags = '\0';
  ChArchiveIn::in<chrono::ChContactContainer>(marchive,&local_48);
  local_30.super___shared_ptr<chrono::ChContactContainer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&this->G_acc;
  local_48._value = &local_30;
  local_30.super___shared_ptr<chrono::ChContactContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&PTR__ChFunctorArchiveIn_00b2ade0;
  local_48._name = "G_acc";
  local_48._flags = '\0';
  (**(code **)(*(long *)marchive + 0x60))(marchive,&local_48);
  local_48._value = (shared_ptr<chrono::ChContactContainer> *)&this->ch_time;
  local_48._name = "ch_time";
  local_48._flags = '\0';
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_48);
  local_48._value = (shared_ptr<chrono::ChContactContainer> *)&this->step;
  local_48._name = "step";
  local_48._flags = '\0';
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_48);
  local_48._value = (shared_ptr<chrono::ChContactContainer> *)&this->step_min;
  local_48._name = "step_min";
  local_48._flags = '\0';
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_48);
  local_48._value = (shared_ptr<chrono::ChContactContainer> *)&this->step_max;
  local_48._name = "step_max";
  local_48._flags = '\0';
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_48);
  local_48._value = (shared_ptr<chrono::ChContactContainer> *)&this->stepcount;
  local_48._name = "stepcount";
  local_48._flags = '\0';
  (**(code **)(*(long *)marchive + 0x48))(marchive,&local_48);
  local_48._value = (shared_ptr<chrono::ChContactContainer> *)&this->write_matrix;
  local_48._name = "write_matrix";
  local_48._flags = '\0';
  (**(code **)(*(long *)marchive + 0x10))(marchive,&local_48);
  local_48._value = (shared_ptr<chrono::ChContactContainer> *)&this->tol_force;
  local_48._name = "tol_force";
  local_48._flags = '\0';
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_48);
  local_48._value = (shared_ptr<chrono::ChContactContainer> *)&this->maxiter;
  local_48._name = "maxiter";
  local_48._flags = '\0';
  (**(code **)(*(long *)marchive + 0x18))(marchive,&local_48);
  local_48._value = (shared_ptr<chrono::ChContactContainer> *)&this->use_sleeping;
  local_48._name = "use_sleeping";
  local_48._flags = '\0';
  (**(code **)(*(long *)marchive + 0x10))(marchive,&local_48);
  local_48._value = (shared_ptr<chrono::ChContactContainer> *)&this->descriptor;
  local_48._name = "descriptor";
  local_48._flags = '\0';
  ChArchiveIn::in<chrono::ChSystemDescriptor>
            (marchive,(ChNameValue<std::shared_ptr<chrono::ChSystemDescriptor>_> *)&local_48);
  local_48._value = (shared_ptr<chrono::ChContactContainer> *)&this->solver;
  local_48._name = "solver";
  local_48._flags = '\0';
  ChArchiveIn::in<chrono::ChSolver>
            (marchive,(ChNameValue<std::shared_ptr<chrono::ChSolver>_> *)&local_48);
  local_48._value = (shared_ptr<chrono::ChContactContainer> *)&this->min_bounce_speed;
  local_48._name = "min_bounce_speed";
  local_48._flags = '\0';
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_48);
  local_48._value = (shared_ptr<chrono::ChContactContainer> *)&this->max_penetration_recovery_speed;
  local_48._name = "max_penetration_recovery_speed";
  local_48._flags = '\0';
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_48);
  local_48._value = (shared_ptr<chrono::ChContactContainer> *)&this->collision_system;
  local_48._name = "collision_system";
  local_48._flags = '\0';
  ChArchiveIn::in<chrono::collision::ChCollisionSystem>
            (marchive,(ChNameValue<std::shared_ptr<chrono::collision::ChCollisionSystem>_> *)
                      &local_48);
  local_48._value = (shared_ptr<chrono::ChContactContainer> *)&this->timestepper;
  local_48._name = "timestepper";
  local_48._flags = '\0';
  ChArchiveIn::in<chrono::ChTimestepper>
            (marchive,(ChNameValue<std::shared_ptr<chrono::ChTimestepper>_> *)&local_48);
  peVar1 = (this->timestepper).super___shared_ptr<chrono::ChTimestepper,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  (*peVar1->_vptr_ChTimestepper[5])(peVar1,this);
  Reference_LM_byID(this);
  (*(this->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x3d])(this);
  return;
}

Assistant:

void ChSystem::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/marchive.VersionRead<ChSystem>();

    // deserialize unerlying assembly
    assembly.ArchiveIN(marchive);

    // stream in all member data:

    marchive >> CHNVP(contact_container);

    marchive >> CHNVP(G_acc);
    marchive >> CHNVP(ch_time);
    marchive >> CHNVP(step);
    marchive >> CHNVP(step_min);
    marchive >> CHNVP(step_max);
    marchive >> CHNVP(stepcount);
    marchive >> CHNVP(write_matrix);

    marchive >> CHNVP(tol_force);
    marchive >> CHNVP(maxiter);
    marchive >> CHNVP(use_sleeping);

    marchive >> CHNVP(descriptor);
    marchive >> CHNVP(solver);

    marchive >> CHNVP(min_bounce_speed);
    marchive >> CHNVP(max_penetration_recovery_speed);

    marchive >> CHNVP(collision_system);  // ChCollisionSystem should implement class factory for abstract create

    marchive >> CHNVP(timestepper);  // ChTimestepper should implement class factory for abstract create
    timestepper->SetIntegrable(this);

    //***TODO*** complete...

    //  Rebuild link pointers to markers
    Reference_LM_byID();

    // Recompute statistics, offsets, etc.
    Setup();
}